

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborarray.cpp
# Opt level: O0

QCborValue * __thiscall QCborArray::extract(QCborArray *this,iterator it)

{
  QCborContainerPrivate *in_RSI;
  QCborValue *in_RDI;
  QCborValue *v;
  QCborValue *idx;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 uVar1;
  QCborContainerPrivate *this_00;
  
  idx = in_RDI;
  this_00 = in_RSI;
  detach((QCborArray *)in_RSI,(qsizetype)in_RDI);
  uVar1 = 0;
  *(undefined1 **)&idx->t = &DAT_aaaaaaaaaaaaaaaa;
  idx->n = (qint64)&DAT_aaaaaaaaaaaaaaaa;
  idx->container = (QCborContainerPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QExplicitlySharedDataPointer<QCborContainerPrivate>::operator->
            ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x476088);
  QCborContainerPrivate::extractAt(in_RSI,(qsizetype)idx);
  QExplicitlySharedDataPointer<QCborContainerPrivate>::operator->
            ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x4760a4);
  QCborContainerPrivate::removeAt(this_00,CONCAT17(uVar1,in_stack_ffffffffffffffd8));
  return in_RDI;
}

Assistant:

QCborValue QCborArray::extract(iterator it)
{
    detach();

    QCborValue v = d->extractAt(it.item.i);
    d->removeAt(it.item.i);
    return v;
}